

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O3

UINT8 __thiscall
PlayerA::PlayCallback(PlayerA *this,PlayerBase *player,UINT8 evtType,void *evtParam)

{
  uint uVar1;
  PlayerBase *pPVar2;
  UINT8 UVar3;
  UINT32 UVar4;
  undefined7 in_register_00000011;
  UINT32 *curLoop;
  
  if ((int)CONCAT71(in_register_00000011,evtType) == 4) {
    this->_myPlayState = this->_myPlayState | 2;
    UVar4 = (*player->_vptr_PlayerBase[0x1a])(player,2);
    this->_endSilenceStart = UVar4;
  }
  else {
    if ((this->_plrCbFunc != (PLAYER_EVENT_CB)0x0) &&
       (UVar3 = (*this->_plrCbFunc)(player,this->_plrCbParam,evtType,evtParam), UVar3 != '\0')) {
      return UVar3;
    }
    if ((((evtType == '\x03') && (uVar1 = (this->_config).loopCount, uVar1 != 0)) &&
        (uVar1 <= *evtParam)) &&
       ((pPVar2 = this->_player, pPVar2 != (PlayerBase *)0x0 && (this->_fadeSmplStart == 0xffffffff)
        ))) {
      UVar4 = (*pPVar2->_vptr_PlayerBase[0x1a])(pPVar2,2);
      this->_fadeSmplStart = UVar4;
    }
  }
  return '\0';
}

Assistant:

UINT8 PlayerA::PlayCallback(PlayerBase* player, UINT8 evtType, void* evtParam)
{
	UINT8 retVal = 0x00;
	
	if (evtType != PLREVT_END)	// We will generate our own PLREVT_END event depending on fading/endSilence.
	{
		if (_plrCbFunc != NULL)
			retVal = _plrCbFunc(player, _plrCbParam, evtType, evtParam);
		if (retVal)
			return retVal;
	}
	
	switch(evtType)
	{
	case PLREVT_START:
	case PLREVT_STOP:
		break;
	case PLREVT_LOOP:
		{
			UINT32* curLoop = (UINT32*)evtParam;
			if (_config.loopCount > 0 && *curLoop >= _config.loopCount)
			{
				//if (_config.fadeSmpls == 0)
				//	return 0x01;	// send "stop" signal to player engine
				FadeOut();
			}
		}
		break;
	case PLREVT_END:
		_myPlayState |= PLAYSTATE_END;
		_endSilenceStart = player->GetCurPos(PLAYPOS_SAMPLE);
		break;
	}
	return 0x00;
}